

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void __thiscall Moc::parseInterfaces(Moc *this,ClassDef *def)

{
  bool bVar1;
  qsizetype qVar2;
  reference pIVar3;
  QMap<QByteArray,_QByteArray> *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  QByteArray iid;
  QList<ClassDef::Interface> iface;
  rvalue_ref in_stack_fffffffffffffe88;
  Parser *in_stack_fffffffffffffe90;
  Parser *in_stack_fffffffffffffe98;
  Parser *key;
  undefined1 *local_128;
  undefined1 *local_120;
  char *msg;
  Parser *in_stack_fffffffffffffef0;
  QList<ClassDef::Interface> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Parser::next(in_stack_fffffffffffffe90,(Token)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  do {
    bVar1 = Parser::test(in_stack_fffffffffffffe98,(Token)((ulong)in_stack_fffffffffffffe90 >> 0x20)
                        );
    if (!bVar1) {
      Parser::next(in_stack_fffffffffffffe90,(Token)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_00135e6f:
      __stack_chk_fail();
    }
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (Interface *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<ClassDef::Interface>::QList((QList<ClassDef::Interface> *)0x135adc);
    Parser::lexem(in_stack_fffffffffffffe98);
    ClassDef::Interface::Interface
              ((Interface *)in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->className);
    QList<ClassDef::Interface>::operator+=
              ((QList<ClassDef::Interface> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    ClassDef::Interface::~Interface((Interface *)in_stack_fffffffffffffe90);
    QByteArray::~QByteArray((QByteArray *)0x135b32);
    while (bVar1 = Parser::test(in_stack_fffffffffffffe98,
                                (Token)((ulong)in_stack_fffffffffffffe90 >> 0x20)), bVar1) {
      Parser::lexem(in_stack_fffffffffffffe98);
      QList<ClassDef::Interface>::last((QList<ClassDef::Interface> *)in_stack_fffffffffffffe88);
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->className);
      QByteArray::~QByteArray((QByteArray *)0x135b86);
      Parser::next(in_stack_fffffffffffffe90,(Token)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      Parser::lexem(in_stack_fffffffffffffe98);
      QList<ClassDef::Interface>::last((QList<ClassDef::Interface> *)in_stack_fffffffffffffe88);
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->className);
      QByteArray::~QByteArray((QByteArray *)0x135bd1);
    }
    while (bVar1 = Parser::test(in_stack_fffffffffffffe98,
                                (Token)((ulong)in_stack_fffffffffffffe90 >> 0x20)), bVar1) {
      Parser::next(in_stack_fffffffffffffe90,(Token)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      Parser::lexem(in_stack_fffffffffffffe98);
      ClassDef::Interface::Interface
                ((Interface *)in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->className);
      QList<ClassDef::Interface>::operator+=
                ((QList<ClassDef::Interface> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      ClassDef::Interface::~Interface((Interface *)in_stack_fffffffffffffe90);
      QByteArray::~QByteArray((QByteArray *)0x135c55);
      while (bVar1 = Parser::test(in_stack_fffffffffffffe98,
                                  (Token)((ulong)in_stack_fffffffffffffe90 >> 0x20)), bVar1) {
        Parser::lexem(in_stack_fffffffffffffe98);
        QList<ClassDef::Interface>::last((QList<ClassDef::Interface> *)in_stack_fffffffffffffe88);
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->className);
        QByteArray::~QByteArray((QByteArray *)0x135ca9);
        Parser::next(in_stack_fffffffffffffe90,(Token)((ulong)in_stack_fffffffffffffe88 >> 0x20));
        Parser::lexem(in_stack_fffffffffffffe98);
        QList<ClassDef::Interface>::last((QList<ClassDef::Interface> *)in_stack_fffffffffffffe88);
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->className);
        QByteArray::~QByteArray((QByteArray *)0x135ceb);
      }
    }
    in_stack_fffffffffffffe98 = (Parser *)0x0;
    while (key = in_stack_fffffffffffffe98, qVar2 = QList<ClassDef::Interface>::size(&local_20),
          (long)in_stack_fffffffffffffe98 < qVar2) {
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      local_120 = &DAT_aaaaaaaaaaaaaaaa;
      msg = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffe88 = (rvalue_ref)(in_RDI + 8);
      in_stack_fffffffffffffe90 =
           (Parser *)
           QList<ClassDef::Interface>::at
                     ((QList<ClassDef::Interface> *)in_stack_fffffffffffffe90,
                      (qsizetype)in_stack_fffffffffffffe88);
      QByteArray::QByteArray((QByteArray *)0x135d7a);
      QMap<QByteArray,_QByteArray>::value(in_RSI,(QByteArray *)key,in_RDI);
      QByteArray::~QByteArray((QByteArray *)0x135d9c);
      bVar1 = QByteArray::isEmpty((QByteArray *)0x135da6);
      if (bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          Parser::error(in_stack_fffffffffffffef0,msg);
        }
        goto LAB_00135e6f;
      }
      pIVar3 = QList<ClassDef::Interface>::operator[]
                         ((QList<ClassDef::Interface> *)in_stack_fffffffffffffe90,
                          (qsizetype)in_stack_fffffffffffffe88);
      QByteArray::operator=(&pIVar3->interfaceId,(QByteArray *)&local_128);
      QByteArray::~QByteArray((QByteArray *)0x135e04);
      in_stack_fffffffffffffe98 = (Parser *)((long)&(key->symbols).d.d + 1);
    }
    QList<QList<ClassDef::Interface>_>::operator+=
              ((QList<QList<ClassDef::Interface>_> *)in_stack_fffffffffffffe90,
               (parameter_type)in_stack_fffffffffffffe88);
    QList<ClassDef::Interface>::~QList((QList<ClassDef::Interface> *)0x135e3d);
  } while( true );
}

Assistant:

void Moc::parseInterfaces(ClassDef *def)
{
    next(LPAREN);
    while (test(IDENTIFIER)) {
        QList<ClassDef::Interface> iface;
        iface += ClassDef::Interface(lexem());
        while (test(SCOPE)) {
            iface.last().className += lexem();
            next(IDENTIFIER);
            iface.last().className += lexem();
        }
        while (test(COLON)) {
            next(IDENTIFIER);
            iface += ClassDef::Interface(lexem());
            while (test(SCOPE)) {
                iface.last().className += lexem();
                next(IDENTIFIER);
                iface.last().className += lexem();
            }
        }
        // resolve from classnames to interface ids
        for (qsizetype i = 0; i < iface.size(); ++i) {
            const QByteArray iid = interface2IdMap.value(iface.at(i).className);
            if (iid.isEmpty())
                error("Undefined interface");

            iface[i].interfaceId = iid;
        }
        def->interfaceList += iface;
    }
    next(RPAREN);
}